

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
llvm::SmallVectorImpl<std::pair<unsigned_int,llvm::SmallVector<unsigned_int,0u>>>::
emplace_back<int,llvm::SmallVector<unsigned_int,0u>>
          (SmallVectorImpl<std::pair<unsigned_int,llvm::SmallVector<unsigned_int,0u>>> *this,
          int *Args,SmallVector<unsigned_int,_0U> *Args_1)

{
  uint uVar1;
  reference ppVar2;
  
  uVar1 = *(uint *)(this + 8);
  if (*(uint *)(this + 0xc) <= uVar1) {
    SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_false>::
    grow((SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_false>
          *)this,0);
    uVar1 = *(uint *)(this + 8);
  }
  std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>::
  pair<int,_llvm::SmallVector<unsigned_int,_0U>,_true>
            ((pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_> *)
             ((ulong)uVar1 * 0x18 + *(long *)this),Args,Args_1);
  SmallVectorBase::set_size((SmallVectorBase *)this,(ulong)*(uint *)(this + 8) + 1);
  ppVar2 = SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
           ::back((SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
                   *)this);
  return ppVar2;
}

Assistant:

reference emplace_back(ArgTypes &&... Args) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void *)this->end()) T(std::forward<ArgTypes>(Args)...);
    this->set_size(this->size() + 1);
    return this->back();
  }